

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine.hpp
# Opt level: O3

void __thiscall
estl::state_machine<cdplayer>::execute_actions
          (state_machine<cdplayer> *this,state_type state,inputs_type *inputs,outputs_type *outputs)

{
  undefined8 *puVar1;
  actions_fun fn;
  _Any_data _Stack_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  get_action_function((actions_fun *)&_Stack_38,this,state);
  if (local_28 != (code *)0x0) {
    (*local_20)(&_Stack_38,inputs,outputs);
    if (local_28 != (code *)0x0) {
      (*local_28)(&_Stack_38,&_Stack_38,__destroy_functor);
    }
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = &PTR__exception_00107d98;
  __cxa_throw(puVar1,&state_not_found::typeinfo,std::exception::~exception);
}

Assistant:

void execute_actions(state_type state, const inputs_type& inputs, outputs_type& outputs) const {
        const auto fn = get_action_function(state);
        if (!fn) {
            throw state_not_found{};
        }
        fn(inputs, outputs);
    }